

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall
AstWalker::visitFunctionInvocationExpressionAstNode
          (AstWalker *this,FunctionInvocationExpressionAstNode *node)

{
  bool bVar1;
  __shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  shared_ptr<ExpressionAstNode> *expression;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  *__range1;
  FunctionInvocationExpressionAstNode *node_local;
  AstWalker *this_local;
  
  (*this->_vptr_AstWalker[0x1d])(this,node);
  __end1 = std::
           vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
           ::begin(&node->expressions);
  expression = (shared_ptr<ExpressionAstNode> *)
               std::
               vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
               ::end(&node->expressions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<ExpressionAstNode>_*,_std::vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>_>
                                *)&expression);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<ExpressionAstNode>_*,_std::vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>_>
               ::operator*(&__end1)->
               super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    (*this->_vptr_AstWalker[3])(this,peVar2);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<ExpressionAstNode>_*,_std::vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>_>
    ::operator++(&__end1);
  }
  (*this->_vptr_AstWalker[0x2c])(this,node);
  return;
}

Assistant:

void AstWalker::visitFunctionInvocationExpressionAstNode(FunctionInvocationExpressionAstNode* node) noexcept {
  this->onEnterFunctionInvocationExpressionAstNode(node);
  for (auto& expression : node->expressions) {
    this->visitExpressionAstNode(expression.get());
  }
  this->onExitFunctionInvocationExpressionAstNode(node);
}